

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_if_icmpeq(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar1;
  u4 uVar2;
  Value VVar3;
  Value VVar4;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  VVar4 = Frame::popTopOfOperandStack(this_01);
  if (VVar4.type != INT) {
    __assert_fail("value1.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xc46,"void ExecutionEngine::i_if_icmpeq()");
  }
  if ((VVar3._0_8_ & 0xffffffff00000000) == 0x400000000) {
    if (VVar4.data._0_4_ == VVar3.data._0_4_) {
      puVar1 = Frame::getCode(this_01,this_01->pc);
      uVar2 = ((int)(short)((ushort)puVar1[1] << 8) | (uint)puVar1[2]) + this_01->pc;
    }
    else {
      uVar2 = this_01->pc + 3;
    }
    this_01->pc = uVar2;
    return;
  }
  __assert_fail("value2.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xc47,"void ExecutionEngine::i_if_icmpeq()");
}

Assistant:

void ExecutionEngine::i_if_icmpeq() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();
	
	Value value2 = topFrame->popTopOfOperandStack();
	Value value1 = topFrame->popTopOfOperandStack();
	assert(value1.type == ValueType::INT);
	assert(value2.type == ValueType::INT);
	
	if (value1.data.intValue == value2.data.intValue) {
		u1 *code = topFrame->getCode(topFrame->pc);
		u1 byte1 = code[1];
		u1 byte2 = code[2];
		int16_t branchOffset = (byte1 << 8) | byte2;
		topFrame->pc += branchOffset;
    } else {
		topFrame->pc += 3;
    }
}